

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  uint uVar1;
  ZSTD_strategy ZVar2;
  
  ZSTD_getCParams(__return_storage_ptr__,CCtxParams->compressionLevel,srcSizeHint,dictSize);
  if ((CCtxParams->ldmParams).enableLdm != 0) {
    __return_storage_ptr__->windowLog = 0x1b;
  }
  uVar1 = (CCtxParams->cParams).windowLog;
  if (uVar1 != 0) {
    __return_storage_ptr__->windowLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).hashLog;
  if (uVar1 != 0) {
    __return_storage_ptr__->hashLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).chainLog;
  if (uVar1 != 0) {
    __return_storage_ptr__->chainLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).searchLog;
  if (uVar1 != 0) {
    __return_storage_ptr__->searchLog = uVar1;
  }
  uVar1 = (CCtxParams->cParams).searchLength;
  if (uVar1 != 0) {
    __return_storage_ptr__->searchLength = uVar1;
  }
  uVar1 = (CCtxParams->cParams).targetLength;
  if (uVar1 != 0) {
    __return_storage_ptr__->targetLength = uVar1;
  }
  ZVar2 = (CCtxParams->cParams).strategy;
  if (ZVar2 != 0) {
    __return_storage_ptr__->strategy = ZVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.searchLength) cParams.searchLength = CCtxParams->cParams.searchLength;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    return cParams;
}